

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::LSR_ZP_X(CPU *this)

{
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  uint8_t data;
  uint8_t addr;
  CPU *this_local;
  
  this->cycles = 6;
  uVar1 = GetByte(this);
  bVar2 = uVar1 + this->X;
  this->cycles = this->cycles - 1;
  bVar3 = ReadByte(this,(ushort)bVar2);
  (this->field_6).ps = (this->field_6).ps & 0xfe | ((bVar3 & 1) != 0 && -1 < (int)(bVar3 & 1));
  uVar1 = (uint8_t)((int)(uint)bVar3 >> 1);
  this->cycles = this->cycles - 1;
  (this->field_6).ps = (this->field_6).ps & 0xfd | (uVar1 == '\0') << 1;
  (this->field_6).ps = (this->field_6).ps & 0x7f;
  WriteByte(this,(ushort)bVar2,uVar1);
  return;
}

Assistant:

void CPU::LSR_ZP_X()
{
    cycles = 6;
    uint8_t addr = GetByte() + X;
    cycles--;
    uint8_t data = ReadByte(addr);
    C = (data & 0b00000001) > 0;
    data >>= 1;
    cycles--;
    Z = (data == 0);
    N = (data & 0b10000000) > 0;
    WriteByte(addr, data);
}